

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc_lat.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  size_t __n;
  int iVar1;
  int iVar2;
  int iVar3;
  void *__s;
  char *__assertion;
  int w;
  nn_stopwatch stopwatch;
  nn_thread thread;
  
  if (argc != 3) {
    puts("usage: inproc_lat <message-size> <roundtrip-count>");
    return 1;
  }
  iVar1 = atoi(argv[1]);
  message_size = (size_t)iVar1;
  roundtrip_count = atoi(argv[2]);
  iVar1 = nn_socket(1,0x10);
  if (iVar1 == -1) {
    __assertion = "s != -1";
    __line = 0x55;
  }
  else {
    iVar2 = nn_bind(iVar1,"inproc://inproc_lat");
    if (iVar2 < 0) {
      __assertion = "rc >= 0";
      __line = 0x57;
    }
    else {
      w = nn_socket(1,0x10);
      if (w == -1) {
        __assertion = "w != -1";
        __line = 0x5a;
      }
      else {
        iVar2 = nn_connect(w,"inproc://inproc_lat");
        __n = message_size;
        if (iVar2 < 0) {
          __assertion = "rc >= 0";
          __line = 0x5c;
        }
        else {
          __s = malloc(message_size);
          if (__s == (void *)0x0) {
            __assertion = "buf";
            __line = 0x5f;
          }
          else {
            memset(__s,0x6f,__n);
            nn_thread_init(&thread,worker,&w);
            nn_sleep(100);
            nn_stopwatch_init(&stopwatch);
            iVar2 = -1;
            do {
              iVar2 = iVar2 + 1;
              if (iVar2 == roundtrip_count) {
                nn_stopwatch_term(&stopwatch);
                printf("message size: %d [B]\n",message_size & 0xffffffff);
                printf("roundtrip count: %d\n",(ulong)(uint)roundtrip_count);
                printf("average latency: %.3f [us]\n");
                nn_thread_term(&thread);
                free(__s);
                iVar1 = nn_close(iVar1);
                if (iVar1 == 0) {
                  iVar1 = nn_close(w);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  __assertion = "rc == 0";
                  __line = 0x7b;
                }
                else {
                  __assertion = "rc == 0";
                  __line = 0x79;
                }
                goto LAB_00101947;
              }
              iVar3 = nn_send(iVar1,__s,message_size,0);
              if (iVar3 != (int)message_size) {
                __assertion = "rc == (int)message_size";
                __line = 0x6a;
                goto LAB_00101947;
              }
              iVar3 = nn_recv(iVar1,__s);
            } while (iVar3 == (int)message_size);
            __assertion = "rc == (int)message_size";
            __line = 0x6c;
          }
        }
      }
    }
  }
LAB_00101947:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                ,__line,"int main(int, char **)");
}

Assistant:

int main (int argc, char *argv [])
{
    int rc;
    int s;
    int w;
    int i;
    char *buf;
    struct nn_thread thread;
    struct nn_stopwatch stopwatch;
    uint64_t elapsed;
    double latency;

    if (argc != 3) {
        printf ("usage: inproc_lat <message-size> <roundtrip-count>\n");
        return 1;
    }

    message_size = atoi (argv [1]);
    roundtrip_count = atoi (argv [2]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    rc = nn_bind (s, "inproc://inproc_lat");
    assert (rc >= 0);

    w = nn_socket (AF_SP, NN_PAIR);
    assert (w != -1);
    rc = nn_connect (w, "inproc://inproc_lat");
    assert (rc >= 0);

    buf = malloc (message_size);
    assert (buf);
    memset (buf, 111, message_size);

    /*  Wait a bit till the worker thread blocks in nn_recv(). */
    nn_thread_init (&thread, worker, &w);
    nn_sleep (100);

    nn_stopwatch_init (&stopwatch);

    for (i = 0; i != roundtrip_count; i++) {
        rc = nn_send (s, buf, message_size, 0);
        assert (rc == (int)message_size);
        rc = nn_recv (s, buf, message_size, 0);
        assert (rc == (int)message_size);
    }

    elapsed = nn_stopwatch_term (&stopwatch);

    latency = (double) elapsed / (roundtrip_count * 2);
    printf ("message size: %d [B]\n", (int) message_size);
    printf ("roundtrip count: %d\n", (int) roundtrip_count);
    printf ("average latency: %.3f [us]\n", (double) latency);

    nn_thread_term (&thread);
    free (buf);
    rc = nn_close (s);
    assert (rc == 0);
    rc = nn_close (w);
    assert (rc == 0);

    return 0;
}